

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 local_188;
  wasm_val_vec_t results;
  wasm_val_vec_t args;
  wasm_val_t res [4];
  wasm_val_t vals [4];
  wasm_func_t *run_func;
  wasm_extern_vec_t exports;
  wasm_instance_t *instance;
  wasm_extern_vec_t imports;
  wasm_extern_t *externs [1];
  wasm_func_t *callback_func;
  wasm_functype_t *callback_type;
  wasm_valtype_vec_t tuple2;
  wasm_valtype_vec_t tuple1;
  wasm_valtype_t *types [4];
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  printf("Loading binary...\n");
  __stream = fopen("multi.wasm","rb");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar3 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      printf("Compiling module...\n");
      lVar4 = wasm_module_new(uVar2,&module);
      if (lVar4 == 0) {
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        wasm_byte_vec_delete(&module);
        printf("Creating callback...\n");
        tuple1.data = (wasm_valtype_t **)wasm_valtype_new_i32();
        wasm_valtype_new_i64();
        wasm_valtype_new_i64();
        wasm_valtype_new_i32();
        wasm_valtype_vec_new(&tuple2.data,4,&tuple1.data);
        wasm_valtype_vec_copy(&callback_type,&tuple2.data);
        uVar5 = wasm_functype_new(&tuple2.data,&callback_type);
        uVar6 = wasm_func_new(uVar2,uVar5,callback);
        wasm_functype_delete(uVar5);
        printf("Instantiating module...\n");
        imports.data = (wasm_extern_t **)wasm_func_as_extern(uVar6);
        instance = (wasm_instance_t *)0x1;
        imports.size = (size_t)&imports.data;
        exports.data = (wasm_extern_t **)wasm_instance_new(uVar2,lVar4,&instance,0);
        if (exports.data == (wasm_extern_t **)0x0) {
          printf("> Error instantiating module!\n");
          argv_local._4_4_ = 1;
        }
        else {
          wasm_func_delete(uVar6);
          printf("Extracting export...\n");
          wasm_instance_exports(exports.data);
          if (run_func == (wasm_func_t *)0x0) {
            printf("> Error accessing exports!\n");
            argv_local._4_4_ = 1;
          }
          else {
            lVar7 = wasm_extern_as_func(*(undefined8 *)exports.size);
            if (lVar7 == 0) {
              printf("> Error accessing export!\n");
              argv_local._4_4_ = 1;
            }
            else {
              wasm_module_delete(lVar4);
              wasm_instance_delete(exports.data);
              printf("Calling export...\n");
              memset(&res[3].of,0,0x40);
              memset(&args.data,0,0x40);
              args.data._0_1_ = 0x80;
              res[0].of.i32._0_1_ = 0x80;
              res[1].of.i32._0_1_ = 0x80;
              res[2].of.i32._0_1_ = 0x80;
              results.data = (wasm_val_t *)0x4;
              args.size = (size_t)&res[3].of;
              local_188 = 4;
              results.size = (size_t)&args.data;
              lVar4 = wasm_func_call(lVar7,&results.data,&local_188);
              if (lVar4 == 0) {
                wasm_extern_vec_delete(&run_func);
                printf("Printing result...\n");
                printf("> %u %lu %lu %u\n",(ulong)(uint)res[0]._0_4_,res[1]._0_8_,res[2]._0_8_,
                       (ulong)(uint)res[3]._0_4_);
                if (res[0]._0_4_ != 4) {
                  __assert_fail("res[0].of.i32 == 4",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/multi.c"
                                ,0x8f,"int main(int, const char **)");
                }
                if (res[1]._0_8_ != 3) {
                  __assert_fail("res[1].of.i64 == 3",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/multi.c"
                                ,0x90,"int main(int, const char **)");
                }
                if (res[2]._0_8_ != 2) {
                  __assert_fail("res[2].of.i64 == 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/multi.c"
                                ,0x91,"int main(int, const char **)");
                }
                if (res[3]._0_4_ != 1) {
                  __assert_fail("res[3].of.i32 == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/multi.c"
                                ,0x92,"int main(int, const char **)");
                }
                printf("Shutting down...\n");
                wasm_store_delete(uVar2);
                wasm_engine_delete(uVar1);
                printf("Done.\n");
                argv_local._4_4_ = 0;
              }
              else {
                printf("> Error calling function!\n");
                argv_local._4_4_ = 1;
              }
            }
          }
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("multi.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  wasm_valtype_t* types[4] = {
    wasm_valtype_new_i32(), wasm_valtype_new_i64(),
    wasm_valtype_new_i64(), wasm_valtype_new_i32()
  };
  own wasm_valtype_vec_t tuple1, tuple2;
  wasm_valtype_vec_new(&tuple1, 4, types);
  wasm_valtype_vec_copy(&tuple2, &tuple1);
  own wasm_functype_t* callback_type = wasm_functype_new(&tuple1, &tuple2);
  own wasm_func_t* callback_func =
    wasm_func_new(store, callback_type, callback);

  wasm_functype_delete(callback_type);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_t* externs[] = { wasm_func_as_extern(callback_func) };
  wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(callback_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_t vals[4] = {
    WASM_I32_VAL(1), WASM_I64_VAL(2), WASM_I64_VAL(3), WASM_I32_VAL(4)
  };
  wasm_val_t res[4] = {
    WASM_INIT_VAL, WASM_INIT_VAL, WASM_INIT_VAL, WASM_INIT_VAL
  };
  wasm_val_vec_t args = WASM_ARRAY_VEC(vals);
  wasm_val_vec_t results = WASM_ARRAY_VEC(res);
  if (wasm_func_call(run_func, &args, &results)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Print result.
  printf("Printing result...\n");
  printf("> %"PRIu32" %"PRIu64" %"PRIu64" %"PRIu32"\n",
    res[0].of.i32, res[1].of.i64, res[2].of.i64, res[3].of.i32);

  assert(res[0].of.i32 == 4);
  assert(res[1].of.i64 == 3);
  assert(res[2].of.i64 == 2);
  assert(res[3].of.i32 == 1);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}